

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

CreateSignatureHashResponseStruct *
cfd::js::api::ElementsTransactionStructApi::CreateSignatureHash
          (CreateSignatureHashResponseStruct *__return_storage_ptr__,
          CreateElementsSignatureHashRequestStruct *request)

{
  CreateElementsSignatureHashRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateElementsSignatureHashRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateElementsSignatureHashRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateElementsSignatureHashRequestStruct *request_local;
  CreateSignatureHashResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreateSignatureHashResponseStruct::CreateSignatureHashResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::CreateSignatureHash(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateSignatureHash",&local_129);
  ExecuteStructApi<cfd::js::api::CreateElementsSignatureHashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
            ((CreateSignatureHashResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateElementsSignatureHashRequestStruct *)local_108,&local_128,in_R8);
  CreateSignatureHashResponseStruct::operator=
            (__return_storage_ptr__,(CreateSignatureHashResponseStruct *)(local_108 + 0x20));
  CreateSignatureHashResponseStruct::~CreateSignatureHashResponseStruct
            ((CreateSignatureHashResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateElementsSignatureHashRequestStruct_&)>
  ::~function((function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateElementsSignatureHashRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashResponseStruct
ElementsTransactionStructApi::CreateSignatureHash(  // NOLINT
    const CreateElementsSignatureHashRequestStruct& request) {
  auto call_func = [](const CreateElementsSignatureHashRequestStruct& request)
      -> CreateSignatureHashResponseStruct {  // NOLINT
    CreateSignatureHashResponseStruct response;
    std::string sig_hash;
    int64_t amount = request.txin.amount;
    const std::string& hashtype_str = request.txin.hash_type;
    const std::string& value_hex = request.txin.confidential_value_commitment;
    const Txid& txid = Txid(request.txin.txid);
    uint32_t vout = request.txin.vout;
    ConfidentialTransactionContext txc(request.tx);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sighash_type, request.txin.sighash_anyone_can_pay,
        request.txin.sighash_rangeproof);

    Pubkey pubkey;
    Script script;
    if (request.txin.key_data.type == "pubkey") {
      pubkey = Pubkey(request.txin.key_data.hex);
    } else if (request.txin.key_data.type == "redeem_script") {
      script = Script(request.txin.key_data.hex);
    }

    ElementsTransactionApi api;
    HashType hash_type;
    ConfidentialTxInReference txin(ConfidentialTxIn(txid, vout));
    ConfidentialValue value =
        (value_hex.empty())
            ? ConfidentialValue(Amount::CreateBySatoshiAmount(amount))
            : ConfidentialValue(value_hex);
    if (hashtype_str == "p2pkh" || hashtype_str == "p2wpkh" ||
        hashtype_str == "p2sh-p2wpkh") {
      hash_type =
          (hashtype_str == "p2pkh") ? HashType::kP2pkh : HashType::kP2wpkh;
      sig_hash = api.CreateSignatureHash(
          request.tx, txin, pubkey, value, hash_type, sighashtype);
    } else if (
        hashtype_str == "p2sh" || hashtype_str == "p2wsh" ||
        hashtype_str == "p2sh-p2wsh") {
      hash_type =
          (hashtype_str == "p2sh") ? HashType::kP2sh : HashType::kP2wsh;
      sig_hash = api.CreateSignatureHash(
          request.tx, txin, script, value, hash_type, sighashtype);
    } else {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateSignatureHash. Invalid hashtype_str:  "
          "hashtype_str={}",  // NOLINT
          hashtype_str);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hashtype_str. hashtype_str must be \"p2pkh\" "
          "or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" "
          "or \"p2sh-p2wsh\".");  // NOLINT
    }

    response.sighash = sig_hash;
    return response;
  };

  CreateSignatureHashResponseStruct result;
  result = ExecuteStructApi<
      CreateElementsSignatureHashRequestStruct,
      CreateSignatureHashResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}